

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_config.c
# Opt level: O1

piga_client_config * piga_client_config_default(void)

{
  piga_client_config *ppVar1;
  
  ppVar1 = (piga_client_config *)malloc(0xc);
  ppVar1->player_count = '\x10';
  ppVar1->shared_memory_key = 0x1b59;
  ppVar1->event_type_mask = 0x3ff;
  return ppVar1;
}

Assistant:

piga_client_config* piga_client_config_default()
{
    piga_client_config *config = (piga_client_config*) malloc(sizeof(piga_client_config));
    
    // The defaults are received from the host header. These settings must match 
    // with the host!
    config->player_count = PIGA_DEFAULT_PLAYER_COUNT;
    config->shared_memory_key = PIGA_DEFAULT_SHARED_MEMORY_KEY;
    config->event_type_mask = PIGA_EVENT_QUEUE_DEFAULT_TYPE_MASK;
    
    return config;
}